

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagTypes.h
# Opt level: O1

string * __thiscall
JtagShiftedData::GetTDOLengthString_abi_cxx11_
          (string *__return_storage_ptr__,JtagShiftedData *this,bool with_parentheses)

{
  size_t sVar1;
  undefined7 in_register_00000011;
  char *__format;
  S8 bit_count_buffer [128];
  char acStack_98 [136];
  
  __format = "%llu";
  if ((int)CONCAT71(in_register_00000011,with_parentheses) != 0) {
    __format = "(%llu)";
  }
  sprintf(acStack_98,__format,
          (long)(this->mTdoBits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->mTdoBits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_98);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_98,acStack_98 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string GetTDOLengthString( bool with_parentheses = true ) const
    {
        U64 bit_count = mTdoBits.size();
        S8 bit_count_buffer[ 128 ];
        if( with_parentheses )
            sprintf( bit_count_buffer, "(%llu)", bit_count );
        else
            sprintf( bit_count_buffer, "%llu", bit_count );
        std::string bit_count_string = bit_count_buffer;
        return bit_count_string;
    }